

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
::reserve(InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *this,size_t n)

{
  size_t sVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar2;
  iterator ppVar3;
  ulong in_RSI;
  InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *in_RDI;
  int i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ra;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffc8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffd0;
  int local_1c;
  
  sVar1 = capacity(in_RDI);
  if (sVar1 < in_RSI) {
    ppVar2 = pstd::pmr::
             polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
             ::allocate_object<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                       ((polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                         *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = ppVar2 + local_1c;
      ppVar3 = begin(in_RDI);
      pstd::pmr::
      polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>::
      construct<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>,std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                ((polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                  *)in_RDI,in_stack_ffffffffffffffd0,ppVar3 + local_1c);
      ppVar3 = begin(in_RDI);
      pstd::pmr::
      polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>::
      destroy<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                ((polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                  *)in_RDI,ppVar3 + local_1c);
    }
    pstd::pmr::
    polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>::
    deallocate_object<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
              ((polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x444bce);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = ppVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }